

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O1

bool __thiscall gui::TRect::ClipStraightLine(TRect *this,TPoint *a,TPoint *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  byte bVar9;
  
  iVar1 = (this->p0).x;
  iVar2 = (this->p0).y;
  iVar6 = (*a).x;
  iVar8 = (this->p1).x;
  bVar7 = (iVar6 < iVar1) + 2;
  if (iVar6 <= iVar8) {
    bVar7 = iVar6 < iVar1;
  }
  iVar6 = (*a).y;
  bVar9 = bVar7 + 8;
  if (iVar2 <= iVar6) {
    bVar9 = bVar7;
  }
  iVar3 = (this->p1).y;
  bVar7 = bVar9 + 4;
  if (iVar6 <= iVar3) {
    bVar7 = bVar9;
  }
  iVar6 = (*b).x;
  bVar9 = (iVar6 < iVar1) + 2;
  if (iVar6 <= iVar8) {
    bVar9 = iVar6 < iVar1;
  }
  iVar8 = (*b).y;
  bVar4 = bVar9 + 8;
  if (iVar2 <= iVar8) {
    bVar4 = bVar9;
  }
  bVar9 = bVar4 + 4;
  if (iVar8 <= iVar3) {
    bVar9 = bVar4;
  }
  bVar5 = true;
  if (bVar9 != 0 || bVar7 != 0) {
    if ((bVar9 & bVar7) == 0) {
      if (a->x < iVar1) {
        a->x = iVar1;
      }
      if (a->y < iVar2) {
        a->y = iVar2;
      }
      iVar1 = (this->p1).x;
      if (iVar1 < b->x) {
        b->x = iVar1;
      }
      iVar1 = (this->p1).y;
      if (iVar1 <= b->y) {
        b->y = iVar1;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool TRect::ClipStraightLine(TPoint &a, TPoint &b) const {
    int r0 = GetRegion(a);
    int r1 = GetRegion(b);

    // Line is in bound
    if (!(r0 | r1)) {
        return true;
    }

    // Line is invisible
    if (r0 & r1) {
        return false;
    }

    // Clip the line
    if (a.x < p0.x) {
        a.x = p0.x;
    }

    if (a.y < p0.y) {
        a.y = p0.y;
    }

    if (b.x > p1.x) {
        b.x = p1.x;
    }

    if (b.y >= p1.y) {
        b.y = p1.y;
    }

    return true;
}